

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree234.c
# Opt level: O2

void * delpos234_internal(tree234 *t,int index)

{
  node234 *pnVar1;
  node234 *pnVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  node234_conflict *pnVar9;
  uint uVar10;
  void *pvVar11;
  uint uVar12;
  node234_conflict *pnVar13;
  int i;
  ulong uVar14;
  node234_conflict *sib;
  node234 *pnVar15;
  node234_conflict *ptr;
  uint local_5c;
  void *local_50;
  
  local_5c = 0xffffffff;
  local_50 = (void *)0x0;
  pnVar15 = t->root;
LAB_00132e89:
  do {
    do {
      while (iVar6 = index, ptr = pnVar15, ptr == (node234_conflict *)0x0) {
LAB_00132f50:
        if (local_50 == (void *)0x0) {
          local_50 = ptr->elems[(int)local_5c];
        }
        if (local_5c == 0xffffffff) {
          return (void *)0x0;
        }
        pnVar13 = ptr->parent;
        if (((pnVar13 == (node234_conflict *)0x0) && (ptr->elems[1] == (void *)0x0)) &&
           (ptr->kids[0] == (node234 *)0x0)) {
          safefree(ptr);
          t->root = (node234_conflict *)0x0;
          return local_50;
        }
        uVar14 = (ulong)local_5c;
        if ((ptr->kids[0] == (node234 *)0x0) && (ptr->elems[1] != (void *)0x0)) {
          for (; (uVar5 = 2, (int)(uint)uVar14 < 2 &&
                 (uVar5 = (uint)uVar14, ptr->elems[uVar14 + 1] != (void *)0x0)); uVar14 = uVar14 + 1
              ) {
            ptr->elems[uVar14] = ptr->elems[uVar14 + 1];
          }
          ptr->elems[uVar5] = (void *)0x0;
          while (pnVar9 = pnVar13, pnVar9 != (node234_conflict *)0x0) {
            if (pnVar9->kids[0] == ptr) {
              uVar14 = 0;
            }
            else {
              uVar14 = 1;
              if (pnVar9->kids[1] != ptr) {
                uVar14 = (ulong)(pnVar9->kids[2] == ptr) ^ 3;
              }
            }
            pnVar9->counts[uVar14] = pnVar9->counts[uVar14] + -1;
            ptr = pnVar9;
            pnVar13 = pnVar9->parent;
          }
          return local_50;
        }
        pnVar15 = ptr->kids[uVar14];
        pnVar1 = pnVar15;
        if (pnVar15->elems[1] == (void *)0x0) {
          pnVar1 = ptr->kids[uVar14 + 1];
          pnVar2 = pnVar1;
          if (pnVar1->elems[1] == (void *)0x0) {
            pnVar15->elems[1] = ptr->elems[uVar14];
            pnVar2 = pnVar1->kids[0];
            pnVar15->kids[2] = pnVar2;
            pnVar15->counts[2] = pnVar1->counts[0];
            if (pnVar2 != (node234 *)0x0) {
              pnVar2->parent = pnVar15;
            }
            pnVar15->elems[2] = pnVar1->elems[0];
            pnVar2 = pnVar1->kids[1];
            pnVar15->kids[3] = pnVar2;
            pnVar15->counts[3] = pnVar1->counts[1];
            if (pnVar2 != (node234 *)0x0) {
              pnVar2->parent = pnVar15;
            }
            safefree(pnVar1);
            iVar6 = countnode234(pnVar15);
            for (; ptr->counts[uVar14] = iVar6, (int)uVar14 < 2; uVar14 = uVar14 + 1) {
              if (ptr->elems[uVar14 + 1] == (void *)0x0) goto LAB_00133397;
              ptr->elems[uVar14] = ptr->elems[uVar14 + 1];
              ptr->kids[uVar14 + 1] = ptr->kids[uVar14 + 2];
              iVar6 = ptr->counts[uVar14 + 2];
            }
            uVar14 = 2;
LAB_00133397:
            uVar14 = uVar14 & 0xffffffff;
            ptr->elems[uVar14] = (void *)0x0;
            ptr->kids[uVar14 + 1] = (node234 *)0x0;
            ptr->counts[uVar14 + 1] = 0;
            if (ptr->elems[0] == (void *)0x0) {
              t->root = pnVar15;
              pnVar15->parent = (node234_conflict *)0x0;
              safefree(ptr);
            }
            index = pnVar15->counts[0] + pnVar15->counts[1] + 1;
          }
          else {
            do {
              pnVar15 = pnVar2;
              pnVar2 = pnVar15->kids[0];
            } while (pnVar2 != (node234 *)0x0);
            ptr->elems[uVar14] = pnVar15->elems[0];
            pnVar15 = pnVar1;
            index = 0;
          }
        }
        else {
          while (pnVar13 = pnVar1, pnVar13->kids[0] != (node234 *)0x0) {
            pnVar1 = pnVar13->kids[3];
            if (((pnVar13->kids[3] == (node234 *)0x0) &&
                (pnVar1 = pnVar13->kids[2], pnVar13->kids[2] == (node234 *)0x0)) &&
               (pnVar1 = pnVar13->kids[0], pnVar13->kids[1] != (node234 *)0x0)) {
              pnVar1 = pnVar13->kids[1];
            }
          }
          pvVar11 = pnVar13->elems[2];
          if ((pvVar11 == (void *)0x0) && (pvVar11 = pnVar13->elems[1], pvVar11 == (void *)0x0)) {
            pvVar11 = pnVar13->elems[0];
          }
          ptr->elems[uVar14] = pvVar11;
          index = ptr->counts[uVar14] + -1;
        }
      }
      uVar5 = ptr->counts[0];
      if (iVar6 < (int)uVar5) goto code_r0x00132ea1;
      index = ~uVar5 + iVar6;
      if (index < 0) {
        local_5c = 0;
        goto LAB_00132f50;
      }
      bVar3 = true;
      if (index < ptr->counts[1]) {
        uVar10 = 1;
      }
      else {
        index = index + ~ptr->counts[1];
        if (index < 0) {
          local_5c = 1;
          goto LAB_00132f50;
        }
        if (index < ptr->counts[2]) {
          uVar10 = 2;
        }
        else {
          index = index + ~ptr->counts[2];
          if (index < 0) {
            local_5c = 2;
            goto LAB_00132f50;
          }
          bVar3 = false;
          uVar10 = 3;
        }
      }
      uVar14 = (ulong)uVar10;
      pnVar15 = ptr->kids[uVar14];
    } while (pnVar15->elems[1] != (void *)0x0);
    uVar12 = uVar10 - 1;
    pnVar13 = ptr->kids[uVar12];
    if (pnVar13->elems[1] == (void *)0x0) {
      if (bVar3) goto LAB_00132ec1;
      goto LAB_00133038;
    }
    pvVar11 = pnVar13->elems[2];
    pnVar15->elems[1] = pnVar15->elems[0];
    pnVar1 = pnVar15->kids[1];
    pnVar15->kids[1] = pnVar15->kids[0];
    pnVar15->kids[2] = pnVar1;
    *(undefined8 *)(pnVar15->counts + 1) = *(undefined8 *)pnVar15->counts;
    pnVar15->elems[0] = ptr->elems[uVar12];
    uVar5 = (uint)(pvVar11 == (void *)0x0);
    uVar10 = uVar5 ^ 3;
    pnVar1 = pnVar13->kids[uVar10];
    pnVar15->kids[0] = pnVar1;
    pnVar15->counts[0] = pnVar13->counts[uVar10];
    if (pnVar1 != (node234 *)0x0) {
      pnVar1->parent = pnVar15;
    }
    uVar5 = 2 - uVar5;
    ptr->elems[uVar12] = pnVar13->elems[uVar5];
    pnVar13->kids[uVar10] = (node234 *)0x0;
    pnVar13->counts[uVar10] = 0;
    pnVar13->elems[uVar5] = (void *)0x0;
    iVar6 = countnode234(pnVar15);
    ptr->counts[uVar14] = iVar6;
    iVar6 = ptr->counts[uVar12];
    iVar4 = countnode234(pnVar13);
    ptr->counts[uVar12] = iVar4;
    index = (index + iVar6) - iVar4;
  } while( true );
code_r0x00132ea1:
  pnVar15 = ptr->kids[0];
  index = iVar6;
  if (pnVar15->elems[1] == (void *)0x0) {
    uVar14 = 0;
    uVar10 = 0;
LAB_00132ec1:
    pnVar13 = ptr->kids[uVar10 + 1];
    if ((pnVar13 == (node234_conflict *)0x0) || (pnVar13->elems[1] == (void *)0x0)) {
      uVar12 = 0;
      if ((int)uVar5 <= iVar6) {
LAB_00133038:
        uVar12 = uVar10 - 1;
        index = index + ptr->counts[uVar12] + 1;
      }
      uVar14 = (ulong)uVar12;
      pnVar1 = ptr->kids[uVar14];
      pnVar15 = ptr->kids[uVar14 + 1];
      pnVar15->elems[2] = pnVar15->elems[0];
      pnVar15->kids[2] = pnVar15->kids[0];
      pnVar15->kids[3] = pnVar15->kids[1];
      *(undefined8 *)(pnVar15->counts + 2) = *(undefined8 *)pnVar15->counts;
      pnVar15->elems[1] = ptr->elems[uVar14];
      pnVar2 = pnVar1->kids[1];
      pnVar15->kids[1] = pnVar2;
      pnVar15->counts[1] = pnVar1->counts[1];
      if (pnVar2 != (node234 *)0x0) {
        pnVar2->parent = pnVar15;
      }
      pnVar15->elems[0] = pnVar1->elems[0];
      pnVar2 = pnVar1->kids[0];
      pnVar15->kids[0] = pnVar2;
      pnVar15->counts[0] = pnVar1->counts[0];
      if (pnVar2 != (node234 *)0x0) {
        pnVar2->parent = pnVar15;
      }
      iVar6 = countnode234(pnVar15);
      ptr->counts[uVar14 + 1] = iVar6;
      safefree(pnVar1);
      for (lVar7 = 0; iVar6 = (int)lVar7, (int)(uVar12 + iVar6) < 3; lVar7 = lVar7 + 1) {
        if (ptr->kids[uVar14 + lVar7 + 1] == (node234 *)0x0) {
          uVar12 = uVar12 + iVar6;
          ptr->kids[uVar12] = (node234 *)0x0;
          ptr->counts[uVar12] = 0;
          ptr->elems[uVar12] = (void *)0x0;
          goto LAB_001331c2;
        }
        ptr->kids[uVar14 + lVar7] = ptr->kids[uVar14 + lVar7 + 1];
        ptr->counts[uVar14 + lVar7] = ptr->counts[uVar14 + lVar7 + 1];
        if (uVar14 + lVar7 == 2) {
          pvVar11 = (void *)0x0;
        }
        else {
          pvVar11 = ptr->elems[uVar14 + lVar7 + 1];
        }
        ptr->elems[uVar14 + lVar7] = pvVar11;
      }
      uVar5 = uVar12 + iVar6 & 0x7fffffff;
      ptr->kids[uVar5] = (node234 *)0x0;
      ptr->counts[uVar5] = 0;
LAB_001331c2:
      if (ptr->elems[0] == (void *)0x0) {
        t->root = pnVar15;
        pnVar15->parent = (node234_conflict *)0x0;
        safefree(ptr);
      }
    }
    else {
      pnVar15->elems[1] = ptr->elems[uVar14];
      pnVar1 = pnVar13->kids[0];
      pnVar15->kids[2] = pnVar1;
      pnVar15->counts[2] = pnVar13->counts[0];
      if (pnVar1 != (node234 *)0x0) {
        pnVar1->parent = pnVar15;
      }
      ptr->elems[uVar14] = pnVar13->elems[0];
      pnVar13->kids[0] = pnVar13->kids[1];
      pnVar13->counts[0] = pnVar13->counts[1];
      for (lVar7 = -2; lVar7 != 0; lVar7 = lVar7 + 1) {
        pnVar1 = pnVar13[1].kids[lVar7 + -1];
        if (pnVar1 == (node234 *)0x0) {
          uVar5 = (int)lVar7 + 2;
          goto LAB_001332cc;
        }
        pnVar13->kids[lVar7 + 3] = *(node234 **)(pnVar13->counts + lVar7 * 2);
        pnVar13->counts[lVar7 + 3] = *(int *)((long)pnVar13->elems + lVar7 * 4);
        pnVar13->elems[lVar7 + 2] = pnVar1;
      }
      uVar5 = 2;
LAB_001332cc:
      uVar8 = (ulong)uVar5;
      pnVar13->kids[uVar8 + 1] = (node234 *)0x0;
      pnVar13->counts[uVar8 + 1] = 0;
      pnVar13->elems[uVar8] = (void *)0x0;
      iVar6 = countnode234(pnVar15);
      ptr->counts[uVar14] = iVar6;
      iVar6 = countnode234(pnVar13);
      ptr->counts[uVar10 + 1] = iVar6;
    }
  }
  goto LAB_00132e89;
}

Assistant:

static void *delpos234_internal(tree234 * t, int index)
{
    node234 *n;
    void *retval;
    int ei = -1;

    retval = 0;

    n = t->root;
    LOG(("deleting item %d from tree %p\n", index, t));
    while (1) {
        while (n) {
            int ki;
            node234 *sub;

            LOG(
                ("  node %p: %p/%d [%p] %p/%d [%p] %p/%d [%p] %p/%d index=%d\n",
                 n, n->kids[0], n->counts[0], n->elems[0], n->kids[1],
                 n->counts[1], n->elems[1], n->kids[2], n->counts[2],
                 n->elems[2], n->kids[3], n->counts[3], index));
            if (index < n->counts[0]) {
                ki = 0;
            } else if (index -= n->counts[0] + 1, index < 0) {
                ei = 0;
                break;
            } else if (index < n->counts[1]) {
                ki = 1;
            } else if (index -= n->counts[1] + 1, index < 0) {
                ei = 1;
                break;
            } else if (index < n->counts[2]) {
                ki = 2;
            } else if (index -= n->counts[2] + 1, index < 0) {
                ei = 2;
                break;
            } else {
                ki = 3;
            }
            /*
             * Recurse down to subtree ki. If it has only one element,
             * we have to do some transformation to start with.
             */
            LOG(("  moving to subtree %d\n", ki));
            sub = n->kids[ki];
            if (!sub->elems[1]) {
                LOG(("  subtree has only one element!\n"));
                if (ki > 0 && n->kids[ki - 1]->elems[1]) {
                    /*
                     * Case 3a, left-handed variant. Child ki has
                     * only one element, but child ki-1 has two or
                     * more. So we need to move a subtree from ki-1
                     * to ki.
                     *
                     *                . C .                     . B .
                     *               /     \     ->            /     \
                     * [more] a A b B c   d D e      [more] a A b   c C d D e
                     */
                    node234 *sib = n->kids[ki - 1];
                    int lastelem = (sib->elems[2] ? 2 :
                                    sib->elems[1] ? 1 : 0);
                    sub->kids[2] = sub->kids[1];
                    sub->counts[2] = sub->counts[1];
                    sub->elems[1] = sub->elems[0];
                    sub->kids[1] = sub->kids[0];
                    sub->counts[1] = sub->counts[0];
                    sub->elems[0] = n->elems[ki - 1];
                    sub->kids[0] = sib->kids[lastelem + 1];
                    sub->counts[0] = sib->counts[lastelem + 1];
                    if (sub->kids[0])
                        sub->kids[0]->parent = sub;
                    n->elems[ki - 1] = sib->elems[lastelem];
                    sib->kids[lastelem + 1] = NULL;
                    sib->counts[lastelem + 1] = 0;
                    sib->elems[lastelem] = NULL;
                    n->counts[ki] = countnode234(sub);
                    LOG(("  case 3a left\n"));
                    LOG(
                        ("  index and left subtree count before adjustment: %d, %d\n",
                         index, n->counts[ki - 1]));
                    index += n->counts[ki - 1];
                    n->counts[ki - 1] = countnode234(sib);
                    index -= n->counts[ki - 1];
                    LOG(
                        ("  index and left subtree count after adjustment: %d, %d\n",
                         index, n->counts[ki - 1]));
                } else if (ki < 3 && n->kids[ki + 1]
                           && n->kids[ki + 1]->elems[1]) {
                    /*
                     * Case 3a, right-handed variant. ki has only
                     * one element but ki+1 has two or more. Move a
                     * subtree from ki+1 to ki.
                     *
                     *      . B .                             . C .
                     *     /     \                ->         /     \
                     *  a A b   c C d D e [more]      a A b B c   d D e [more]
                     */
                    node234 *sib = n->kids[ki + 1];
                    int j;
                    sub->elems[1] = n->elems[ki];
                    sub->kids[2] = sib->kids[0];
                    sub->counts[2] = sib->counts[0];
                    if (sub->kids[2])
                        sub->kids[2]->parent = sub;
                    n->elems[ki] = sib->elems[0];
                    sib->kids[0] = sib->kids[1];
                    sib->counts[0] = sib->counts[1];
                    for (j = 0; j < 2 && sib->elems[j + 1]; j++) {
                        sib->kids[j + 1] = sib->kids[j + 2];
                        sib->counts[j + 1] = sib->counts[j + 2];
                        sib->elems[j] = sib->elems[j + 1];
                    }
                    sib->kids[j + 1] = NULL;
                    sib->counts[j + 1] = 0;
                    sib->elems[j] = NULL;
                    n->counts[ki] = countnode234(sub);
                    n->counts[ki + 1] = countnode234(sib);
                    LOG(("  case 3a right\n"));
                } else {
                    /*
                     * Case 3b. ki has only one element, and has no
                     * neighbour with more than one. So pick a
                     * neighbour and merge it with ki, taking an
                     * element down from n to go in the middle.
                     *
                     *      . B .                .
                     *     /     \     ->        |
                     *  a A b   c C d      a A b B c C d
                     *
                     * (Since at all points we have avoided
                     * descending to a node with only one element,
                     * we can be sure that n is not reduced to
                     * nothingness by this move, _unless_ it was
                     * the very first node, ie the root of the
                     * tree. In that case we remove the now-empty
                     * root and replace it with its single large
                     * child as shown.)
                     */
                    node234 *sib;
                    int j;

                    if (ki > 0) {
                        ki--;
                        index += n->counts[ki] + 1;
                    }
                    sib = n->kids[ki];
                    sub = n->kids[ki + 1];

                    sub->kids[3] = sub->kids[1];
                    sub->counts[3] = sub->counts[1];
                    sub->elems[2] = sub->elems[0];
                    sub->kids[2] = sub->kids[0];
                    sub->counts[2] = sub->counts[0];
                    sub->elems[1] = n->elems[ki];
                    sub->kids[1] = sib->kids[1];
                    sub->counts[1] = sib->counts[1];
                    if (sub->kids[1])
                        sub->kids[1]->parent = sub;
                    sub->elems[0] = sib->elems[0];
                    sub->kids[0] = sib->kids[0];
                    sub->counts[0] = sib->counts[0];
                    if (sub->kids[0])
                        sub->kids[0]->parent = sub;

                    n->counts[ki + 1] = countnode234(sub);

                    sfree(sib);

                    /*
                     * That's built the big node in sub. Now we
                     * need to remove the reference to sib in n.
                     */
                    for (j = ki; j < 3 && n->kids[j + 1]; j++) {
                        n->kids[j] = n->kids[j + 1];
                        n->counts[j] = n->counts[j + 1];
                        n->elems[j] = j < 2 ? n->elems[j + 1] : NULL;
                    }
                    n->kids[j] = NULL;
                    n->counts[j] = 0;
                    if (j < 3)
                        n->elems[j] = NULL;
                    LOG(("  case 3b ki=%d\n", ki));

                    if (!n->elems[0]) {
                        /*
                         * The root is empty and needs to be
                         * removed.
                         */
                        LOG(("  shifting root!\n"));
                        t->root = sub;
                        sub->parent = NULL;
                        sfree(n);
                    }
                }
            }
            n = sub;
        }
        if (!retval)
            retval = n->elems[ei];

        if (ei == -1)
            return NULL;               /* although this shouldn't happen */

        /*
         * Treat special case: this is the one remaining item in
         * the tree. n is the tree root (no parent), has one
         * element (no elems[1]), and has no kids (no kids[0]).
         */
        if (!n->parent && !n->elems[1] && !n->kids[0]) {
            LOG(("  removed last element in tree\n"));
            sfree(n);
            t->root = NULL;
            return retval;
        }

        /*
         * Now we have the element we want, as n->elems[ei], and we
         * have also arranged for that element not to be the only
         * one in its node. So...
         */

        if (!n->kids[0] && n->elems[1]) {
            /*
             * Case 1. n is a leaf node with more than one element,
             * so it's _really easy_. Just delete the thing and
             * we're done.
             */
            int i;
            LOG(("  case 1\n"));
            for (i = ei; i < 2 && n->elems[i + 1]; i++)
                n->elems[i] = n->elems[i + 1];
            n->elems[i] = NULL;
            /*
             * Having done that to the leaf node, we now go back up
             * the tree fixing the counts.
             */
            while (n->parent) {
                int childnum;
                childnum = (n->parent->kids[0] == n ? 0 :
                            n->parent->kids[1] == n ? 1 :
                            n->parent->kids[2] == n ? 2 : 3);
                n->parent->counts[childnum]--;
                n = n->parent;
            }
            return retval;             /* finished! */
        } else if (n->kids[ei]->elems[1]) {
            /*
             * Case 2a. n is an internal node, and the root of the
             * subtree to the left of e has more than one element.
             * So find the predecessor p to e (ie the largest node
             * in that subtree), place it where e currently is, and
             * then start the deletion process over again on the
             * subtree with p as target.
             */
            node234 *m = n->kids[ei];
            void *target;
            LOG(("  case 2a\n"));
            while (m->kids[0]) {
                m = (m->kids[3] ? m->kids[3] :
                     m->kids[2] ? m->kids[2] :
                     m->kids[1] ? m->kids[1] : m->kids[0]);
            }
            target = (m->elems[2] ? m->elems[2] :
                      m->elems[1] ? m->elems[1] : m->elems[0]);
            n->elems[ei] = target;
            index = n->counts[ei] - 1;
            n = n->kids[ei];
        } else if (n->kids[ei + 1]->elems[1]) {
            /*
             * Case 2b, symmetric to 2a but s/left/right/ and
             * s/predecessor/successor/. (And s/largest/smallest/).
             */
            node234 *m = n->kids[ei + 1];
            void *target;
            LOG(("  case 2b\n"));
            while (m->kids[0]) {
                m = m->kids[0];
            }
            target = m->elems[0];
            n->elems[ei] = target;
            n = n->kids[ei + 1];
            index = 0;
        } else {
            /*
             * Case 2c. n is an internal node, and the subtrees to
             * the left and right of e both have only one element.
             * So combine the two subnodes into a single big node
             * with their own elements on the left and right and e
             * in the middle, then restart the deletion process on
             * that subtree, with e still as target.
             */
            node234 *a = n->kids[ei], *b = n->kids[ei + 1];
            int j;

            LOG(("  case 2c\n"));
            a->elems[1] = n->elems[ei];
            a->kids[2] = b->kids[0];
            a->counts[2] = b->counts[0];
            if (a->kids[2])
                a->kids[2]->parent = a;
            a->elems[2] = b->elems[0];
            a->kids[3] = b->kids[1];
            a->counts[3] = b->counts[1];
            if (a->kids[3])
                a->kids[3]->parent = a;
            sfree(b);
            n->counts[ei] = countnode234(a);
            /*
             * That's built the big node in a, and destroyed b. Now
             * remove the reference to b (and e) in n.
             */
            for (j = ei; j < 2 && n->elems[j + 1]; j++) {
                n->elems[j] = n->elems[j + 1];
                n->kids[j + 1] = n->kids[j + 2];
                n->counts[j + 1] = n->counts[j + 2];
            }
            n->elems[j] = NULL;
            n->kids[j + 1] = NULL;
            n->counts[j + 1] = 0;
            /*
             * It's possible, in this case, that we've just removed
             * the only element in the root of the tree. If so,
             * shift the root.
             */
            if (n->elems[0] == NULL) {
                LOG(("  shifting root!\n"));
                t->root = a;
                a->parent = NULL;
                sfree(n);
            }
            /*
             * Now go round the deletion process again, with n
             * pointing at the new big node and e still the same.
             */
            n = a;
            index = a->counts[0] + a->counts[1] + 1;
        }
    }
}